

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cal2jd.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  double *pdVar1;
  int *piVar2;
  undefined8 uVar3;
  int iVar4;
  double dVar5;
  initializer_list<double> __l;
  vector<double,_std::allocator<double>_> gregorian_vect;
  allocator local_99;
  double local_98;
  double *local_90;
  double local_88;
  double local_80 [2];
  vector<double,_std::allocator<double>_> local_70;
  double local_58;
  double *local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  if (argc == 2) {
LAB_00102362:
    std::__cxx11::string::string((string *)&local_90,argv[1],&local_99);
    pdVar1 = local_90;
    piVar2 = __errno_location();
    iVar4 = *piVar2;
    *piVar2 = 0;
    dVar5 = strtod((char *)pdVar1,(char **)&local_70);
    if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start == pdVar1) {
LAB_0010263a:
      std::__throw_invalid_argument("stod");
LAB_00102646:
      std::__throw_invalid_argument("stod");
LAB_00102652:
      uVar3 = std::__throw_invalid_argument("stod");
      if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      _Unwind_Resume(uVar3);
    }
    if (*piVar2 == 0) {
LAB_001024c6:
      *piVar2 = iVar4;
    }
    else if (*piVar2 == 0x22) {
      std::__throw_out_of_range("stod");
LAB_001023c2:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cal2jd v",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"1.3.0",5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nUSAGE: May be called in one of two ways:\n",0x2a);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"    1: cal2jd YYYYMMDD.<day fraction>\n",0x26);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"    2: cal2jd <year> <month> <day>.<day fraction>\n",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"RETURNED: Julian Date\n\n",0x17);
      return 0;
    }
    dVar5 = (double)CEDate::Gregorian2JD(dVar5);
    local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = local_90;
    if (local_90 == local_80) goto LAB_0010260f;
  }
  else {
    if (argc != 4) goto LAB_001023c2;
    std::__cxx11::string::string((string *)&local_90,argv[1],&local_99);
    pdVar1 = local_90;
    piVar2 = __errno_location();
    iVar4 = *piVar2;
    *piVar2 = 0;
    local_50 = (double *)strtod((char *)pdVar1,(char **)&local_70);
    if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start == pdVar1) {
      std::__throw_invalid_argument("stod");
      goto LAB_0010263a;
    }
    if (*piVar2 == 0) {
      *piVar2 = iVar4;
    }
    else if (*piVar2 == 0x22) {
      std::__throw_out_of_range("stod");
      goto LAB_00102362;
    }
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
    std::__cxx11::string::string((string *)&local_90,argv[2],&local_99);
    pdVar1 = local_90;
    iVar4 = *piVar2;
    *piVar2 = 0;
    dVar5 = strtod((char *)local_90,(char **)&local_70);
    if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start == pdVar1) goto LAB_00102646;
    local_58 = dVar5;
    if (*piVar2 == 0) {
      *piVar2 = iVar4;
    }
    else if (*piVar2 == 0x22) {
      dVar5 = (double)std::__throw_out_of_range("stod");
      goto LAB_001024c6;
    }
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
    std::__cxx11::string::string((string *)&local_90,argv[3],&local_99);
    pdVar1 = local_90;
    iVar4 = *piVar2;
    *piVar2 = 0;
    dVar5 = strtod((char *)local_90,(char **)&local_70);
    if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start == pdVar1) goto LAB_00102652;
    if (*piVar2 == 0) {
LAB_0010254f:
      *piVar2 = iVar4;
    }
    else if (*piVar2 == 0x22) {
      std::__throw_out_of_range("stod");
      goto LAB_0010254f;
    }
    local_98 = dVar5;
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
    local_90 = local_50;
    local_88 = local_58;
    local_80[0] = floor(local_98);
    local_80[1] = 0.0;
    __l._M_len = 4;
    __l._M_array = (iterator)&local_90;
    std::vector<double,_std::allocator<double>_>::vector(&local_70,__l,(allocator_type *)&local_99);
    local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[3] = local_98 -
                  local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[2];
    std::vector<double,_std::allocator<double>_>::vector(&local_48,&local_70);
    local_98 = (double)CEDate::GregorianVect2JD(&local_48);
    if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    dVar5 = local_98;
    if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start == (double *)0x0) goto LAB_0010260f;
  }
  local_98 = dVar5;
  operator_delete(local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start);
  dVar5 = local_98;
LAB_0010260f:
  printf("%f\n",dVar5);
  return 0;
}

Assistant:

int main(int argc, const char * argv[]) {
    
    // variable to hold the julian date
    double jd(0.0) ;
    
    // Check that we've been passed an actual argument
    if ((argc != 2)&&(argc != 4)) {
        // Print some usage information
        std::cout << "cal2jd v" << CPPEPHEM_VERSION << "\n";
        std::cout << "\nUSAGE: May be called in one of two ways:\n";
        std::cout << "    1: cal2jd YYYYMMDD.<day fraction>\n" ;
        std::cout << "    2: cal2jd <year> <month> <day>.<day fraction>\n" ;
        std::cout << "RETURNED: Julian Date\n\n" ;
        return 0 ;
    } else if (argc == 2) {
        jd = CEDate::Gregorian2JD(std::stod(argv[1])) ;
    } else if (argc == 4) {
        // First get the year, month, day information from the pass parameters
        double year(std::stod(argv[1]));
        double month(std::stod(argv[2]));
        double day(std::stod(argv[3]));
        std::vector<double> gregorian_vect = {year, month, std::floor(day), 0.0} ;
        gregorian_vect[3] = day - gregorian_vect[2] ;
                
        // Now compute the julian date
        jd = CEDate::GregorianVect2JD(gregorian_vect) ;
    }
    
    // Print the result
    std::printf("%f\n", jd) ;
    
    return 0 ;
}